

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O3

void stackjit::Amd64Backend::moveMemoryRegWithIntOffsetToReg
               (CodeGen *codeGen,FloatRegisters dest,Registers srcMemReg,int offset)

{
  pointer *ppuVar1;
  undefined7 in_register_00000011;
  Registers *__args;
  iterator iVar2;
  size_t i;
  long lVar3;
  IntToBytes converter;
  Registers local_2d;
  byte local_2c;
  uchar local_2b [3];
  Registers local_28;
  uchar local_27 [3];
  int local_24;
  
  if ((int)CONCAT71(in_register_00000011,srcMemReg) == 4) {
    local_2b[2] = 0xf3;
    iVar2._M_current =
         (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (codeGen,iVar2,local_2b + 2);
      iVar2._M_current =
           (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *iVar2._M_current = 0xf3;
      iVar2._M_current =
           (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current;
    }
    local_2b[1] = 0xf;
    if (iVar2._M_current ==
        (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (codeGen,iVar2,local_2b + 1);
      iVar2._M_current =
           (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *iVar2._M_current = '\x0f';
      iVar2._M_current =
           (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current;
    }
    local_2b[0] = '\x10';
    if (iVar2._M_current ==
        (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (codeGen,iVar2,local_2b);
      iVar2._M_current =
           (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *iVar2._M_current = '\x10';
      iVar2._M_current =
           (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current;
    }
    local_2c = dest << 3 | 0x84;
    if (iVar2._M_current ==
        (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (codeGen,iVar2,&local_2c);
      iVar2._M_current =
           (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *iVar2._M_current = local_2c;
      iVar2._M_current =
           (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current;
    }
    local_2d = 0x24;
    if (iVar2._M_current ==
        (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __args = &local_2d;
LAB_00145df9:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (codeGen,iVar2,__args);
      goto LAB_00145e01;
    }
    *iVar2._M_current = '$';
  }
  else {
    local_27[2] = 0xf3;
    iVar2._M_current =
         (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (codeGen,iVar2,local_27 + 2);
      iVar2._M_current =
           (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *iVar2._M_current = 0xf3;
      iVar2._M_current =
           (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current;
    }
    local_27[1] = 0xf;
    if (iVar2._M_current ==
        (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (codeGen,iVar2,local_27 + 1);
      iVar2._M_current =
           (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *iVar2._M_current = '\x0f';
      iVar2._M_current =
           (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current;
    }
    local_27[0] = '\x10';
    if (iVar2._M_current ==
        (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (codeGen,iVar2,local_27);
      iVar2._M_current =
           (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      *iVar2._M_current = '\x10';
      iVar2._M_current =
           (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current;
    }
    local_28 = dest << 3 | srcMemReg | 0x80;
    if (iVar2._M_current ==
        (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __args = &local_28;
      goto LAB_00145df9;
    }
    *iVar2._M_current = local_28;
  }
  ppuVar1 = &(codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + 1;
LAB_00145e01:
  local_24 = offset;
  lVar3 = 0;
  do {
    iVar2._M_current =
         (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)codeGen,iVar2,
                 (uchar *)((long)&local_24 + lVar3));
    }
    else {
      *iVar2._M_current = *(uchar *)((long)&local_24 + lVar3);
      ppuVar1 = &(codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return;
}

Assistant:

void Amd64Backend::moveMemoryRegWithIntOffsetToReg(CodeGen& codeGen, FloatRegisters dest, Registers srcMemReg, int offset) {
		if (srcMemReg != Registers::SP) {
			codeGen.push_back(0xf3);
			codeGen.push_back(0x0f);
			codeGen.push_back(0x10);
			codeGen.push_back(0x80 | (Byte)srcMemReg | ((Byte)dest << 3));
		} else {
			codeGen.push_back(0xf3);
			codeGen.push_back(0x0f);
			codeGen.push_back(0x10);
			codeGen.push_back(0x84 | ((Byte)dest << 3));
			codeGen.push_back(0x24);
		}

		IntToBytes converter;
		converter.intValue = offset;

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}